

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrMan.c
# Opt level: O2

void Rwr_ManStop(Rwr_Man_t *p)

{
  void *__ptr;
  Vec_Int_t *__ptr_00;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int i;
  long lVar3;
  int iVar4;
  Vec_Vec_t *p_00;
  
  p_00 = p->vClasses;
  if (p_00 != (Vec_Vec_t *)0x0) {
    for (iVar4 = 0; iVar1 = p_00->nSize, iVar4 < iVar1; iVar4 = iVar4 + 1) {
      lVar3 = 0;
      while( true ) {
        pVVar2 = Vec_VecEntry(p_00,iVar4);
        if (pVVar2->nSize <= lVar3) break;
        pVVar2 = Vec_VecEntry(p->vClasses,iVar4);
        if (pVVar2->nSize <= lVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        __ptr = *(void **)((long)pVVar2->pArray[lVar3] + 0x28);
        free(*(void **)((long)__ptr + 0x10));
        free(__ptr);
        lVar3 = lVar3 + 1;
        p_00 = p->vClasses;
      }
      p_00 = p->vClasses;
    }
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      pVVar2 = Vec_VecEntry(p_00,iVar4);
      if (pVVar2 != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree(pVVar2);
      }
      iVar1 = p_00->nSize;
    }
    Vec_PtrFree((Vec_Ptr_t *)p_00);
  }
  Vec_PtrFree(p->vNodesTemp);
  Vec_PtrFree(p->vForest);
  __ptr_00 = p->vLevNums;
  free(__ptr_00->pArray);
  free(__ptr_00);
  Vec_PtrFree(p->vFanins);
  Vec_PtrFree(p->vFaninsCur);
  Extra_MmFixedStop(p->pMmNode);
  if (p->pMapInv != (unsigned_short *)0x0) {
    free(p->pMapInv);
    p->pMapInv = (unsigned_short *)0x0;
  }
  if (p->pTable != (Rwr_Node_t **)0x0) {
    free(p->pTable);
    p->pTable = (Rwr_Node_t **)0x0;
  }
  if (p->pPractical != (char *)0x0) {
    free(p->pPractical);
    p->pPractical = (char *)0x0;
  }
  free(p->pPerms4);
  free(p);
  return;
}

Assistant:

void Rwr_ManStop( Rwr_Man_t * p )
{
    if ( p->vClasses )
    {
        Rwr_Node_t * pNode;
        int i, k;
        Vec_VecForEachEntry( Rwr_Node_t *, p->vClasses, pNode, i, k )
            Dec_GraphFree( (Dec_Graph_t *)pNode->pNext );
    }
    if ( p->vClasses )  Vec_VecFree( p->vClasses );
    Vec_PtrFree( p->vNodesTemp );
    Vec_PtrFree( p->vForest );
    Vec_IntFree( p->vLevNums );
    Vec_PtrFree( p->vFanins );
    Vec_PtrFree( p->vFaninsCur );
    Extra_MmFixedStop( p->pMmNode );
    ABC_FREE( p->pMapInv );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pPractical );
    ABC_FREE( p->pPerms4 );
    ABC_FREE( p );
}